

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS
ref_fixture_pri_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n,REF_INT l0)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  REF_INT cell;
  REF_INT quad [5];
  REF_INT tri [4];
  REF_INT pri [6];
  REF_INT node;
  int local_130;
  int local_128;
  REF_INT local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint uStack_10c;
  undefined4 local_108;
  uint local_fc;
  REF_DBL local_f8;
  REF_GRID_conflict local_f0;
  ulong local_e8;
  uint local_dc;
  uint local_d8;
  undefined8 local_d4;
  undefined4 local_cc;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  REF_DBL local_a8;
  int local_a0;
  uint local_9c;
  double local_98;
  double local_90;
  uint local_84;
  double local_80;
  ulong local_78;
  ulong local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  ulong local_48;
  int local_3c;
  REF_NODE local_38;
  
  uVar17 = (ulong)(uint)l;
  uVar4 = 0;
  if (0 < l0) {
    uVar4 = l0;
  }
  uVar11 = l - 1;
  if ((int)uVar11 <= (int)uVar4) {
    uVar4 = uVar11;
  }
  local_b0 = z1;
  local_98 = z0;
  local_90 = y1;
  local_80 = y0;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  uVar7 = (ulong)uVar3;
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    local_fc = uVar11;
    if (pRVar1->mpi->id == 0) {
      local_dc = m - 1;
      local_84 = n - 1;
      local_f0 = pRVar1;
      local_e8 = (ulong)(uint)m;
      local_c0 = (ulong)(uint)n;
      local_b8 = uVar17;
      local_78 = (ulong)uVar4;
      if (0 < n) {
        dVar25 = (local_90 - local_80) / (double)(int)local_dc;
        dVar23 = (local_b0 - local_98) / (double)(int)local_84;
        local_48 = (ulong)(uint)(m * l);
        uVar22 = 0;
        iVar5 = 0;
        dVar24 = local_98;
        dVar26 = local_80;
        local_b0 = dVar23;
        local_90 = dVar25;
        do {
          local_a0 = iVar5;
          local_70 = uVar22;
          if (0 < (int)local_e8) {
            local_a8 = (double)iVar5 * dVar23 + dVar24;
            uVar4 = 0;
            do {
              local_9c = uVar4;
              if (0 < (int)uVar17) {
                local_f8 = (double)(int)uVar4 * dVar25 + dVar26;
                uVar17 = 0;
                do {
                  uVar4 = ref_node_add(ref_node,(long)((int)uVar22 + (int)uVar17),&local_3c);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x5a6,"ref_fixture_pri_brick_args_grid",(ulong)uVar4,"node");
                    return uVar4;
                  }
                  pRVar2 = ref_node->real;
                  lVar8 = (long)local_3c;
                  pRVar2[lVar8 * 0xf] = (double)(int)uVar17 * ((x1 - x0) / (double)(int)uVar11) + x0
                  ;
                  pRVar2[lVar8 * 0xf + 1] = local_f8;
                  pRVar2[lVar8 * 0xf + 2] = local_a8;
                  uVar17 = uVar17 + 1;
                } while ((uint)l != uVar17);
              }
              uVar4 = local_9c + 1;
              uVar22 = uVar22 + (uint)l;
              uVar17 = local_b8;
              dVar23 = local_b0;
              dVar24 = local_98;
              dVar25 = local_90;
              dVar26 = local_80;
            } while (uVar4 != (uint)local_e8);
          }
          iVar5 = local_a0 + 1;
          uVar22 = local_70 + local_48;
        } while (iVar5 != (int)local_c0);
      }
      iVar12 = (int)local_e8;
      iVar5 = (int)local_c0;
      uVar4 = 0;
      local_38 = ref_node;
      if (1 < iVar5) {
        local_a0 = (int)uVar17;
        local_80 = (double)CONCAT44(local_80._4_4_,(iVar12 + 1) * local_a0);
        local_98 = (double)CONCAT44(local_98._4_4_,1);
        local_9c = 0;
        local_48 = CONCAT44(local_48._4_4_,iVar12 * local_a0);
        local_70 = CONCAT44(local_70._4_4_,iVar12 * local_a0);
        uVar22 = local_c0;
        uVar13 = local_e8;
        do {
          if (1 < (int)uVar13) {
            iVar12 = 1;
            local_a8 = (REF_DBL)(ulong)local_9c;
            local_b0 = (double)(local_70 & 0xffffffff);
            local_f8 = (REF_DBL)((ulong)local_80 & 0xffffffff);
            iVar5 = local_a0;
            do {
              local_90 = (double)CONCAT44(local_90._4_4_,iVar12);
              if (1 < (int)uVar17) {
                uVar4 = 0;
                do {
                  iVar15 = SUB84(local_a8,0) + uVar4;
                  local_64 = SUB84(local_a8,0) + uVar4 + 1;
                  iVar18 = iVar5 + 1 + uVar4;
                  iVar12 = SUB84(local_b0,0) + uVar4;
                  local_58 = SUB84(local_b0,0) + 1 + uVar4;
                  iVar19 = SUB84(local_f8,0) + 1 + uVar4;
                  local_68 = iVar15;
                  local_60 = iVar18;
                  local_5c = iVar12;
                  local_54 = iVar19;
                  uVar11 = ref_cell_add(local_f0->cell[10],&local_68,&local_11c);
                  if (uVar11 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x5c0,"ref_fixture_pri_brick_args_grid",(ulong)uVar11,"pri");
                    return uVar11;
                  }
                  local_60 = iVar5 + uVar4;
                  local_54 = SUB84(local_f8,0) + uVar4;
                  local_68 = iVar15;
                  local_64 = iVar18;
                  local_5c = iVar12;
                  local_58 = iVar19;
                  uVar3 = ref_cell_add(local_f0->cell[10],&local_68,&local_11c);
                  uVar11 = (uint)uVar7;
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x5c7,"ref_fixture_pri_brick_args_grid",(ulong)uVar3,"pri");
                    uVar11 = uVar3;
                  }
                  uVar7 = (ulong)uVar11;
                  if (uVar3 != 0) {
                    return uVar11;
                  }
                  uVar4 = uVar4 + 1;
                  uVar22 = local_c0;
                  uVar17 = local_b8;
                } while (local_fc != uVar4);
              }
              iVar12 = local_90._0_4_ + 1;
              iVar15 = (int)uVar17;
              local_f8 = (REF_DBL)(ulong)(uint)(SUB84(local_f8,0) + iVar15);
              iVar5 = iVar5 + iVar15;
              local_b0 = (double)(ulong)(uint)(SUB84(local_b0,0) + iVar15);
              local_a8 = (REF_DBL)(ulong)(uint)(SUB84(local_a8,0) + iVar15);
              uVar13 = local_e8;
            } while (iVar12 != (int)local_e8);
          }
          iVar12 = (int)uVar13;
          uVar4 = (uint)uVar7;
          iVar15 = local_98._0_4_ + 1;
          local_80 = (double)CONCAT44(local_80._4_4_,local_80._0_4_ + (int)local_48);
          local_a0 = local_a0 + (int)local_48;
          local_70 = CONCAT44(local_70._4_4_,(int)local_70 + (int)local_48);
          local_9c = local_9c + (int)local_48;
          local_98 = (double)CONCAT44(local_98._4_4_,iVar15);
          iVar5 = (int)uVar22;
        } while (iVar15 != iVar5);
      }
      local_108 = 1;
      if (1 < iVar5) {
        iVar18 = (int)uVar17;
        iVar19 = iVar12 * iVar18;
        iVar15 = 1;
        uVar11 = 0;
        do {
          uVar3 = uVar11;
          uVar20 = local_dc;
          if (1 < (int)(uint)local_e8) {
            do {
              uStack_10c = uVar3 + iVar19;
              local_110 = (iVar12 + 1) * iVar18 + uVar3;
              uVar10 = (int)uVar17 + uVar3;
              local_118 = uVar3;
              local_114 = uVar10;
              uVar3 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_118,&local_11c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x5d3,"ref_fixture_pri_brick_args_grid",(ulong)uVar3,"qua");
                return uVar3;
              }
              uVar20 = uVar20 - 1;
              uVar17 = local_b8;
              uVar3 = uVar10;
            } while (uVar20 != 0);
          }
          iVar15 = iVar15 + 1;
          uVar11 = uVar11 + iVar19;
          iVar5 = (int)local_c0;
        } while (iVar15 != iVar5);
      }
      local_108 = 2;
      if (1 < iVar5) {
        iVar5 = (int)local_e8;
        iVar12 = (int)uVar17;
        uVar20 = (iVar5 + 2) * iVar12 - 1;
        local_98 = (double)CONCAT44(local_98._4_4_,iVar5 * iVar12);
        uVar3 = iVar12 * 2 - 1;
        uVar10 = (iVar5 + 1) * iVar12 - 1;
        iVar12 = 1;
        uVar11 = local_fc;
        do {
          local_b0 = (double)CONCAT44(local_b0._4_4_,iVar12);
          local_90 = (double)CONCAT44(local_90._4_4_,uVar11);
          local_a8 = (REF_DBL)CONCAT44(local_a8._4_4_,uVar10);
          local_f8 = (REF_DBL)CONCAT44(local_f8._4_4_,uVar3);
          uVar16 = uVar20;
          uVar21 = local_dc;
          if (1 < (int)(uint)local_e8) {
            do {
              local_118 = uVar3;
              local_114 = uVar11;
              local_110 = uVar10;
              uStack_10c = uVar16;
              uVar6 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_118,&local_11c);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x5df,"ref_fixture_pri_brick_args_grid",(ulong)uVar6,"qua");
                return uVar6;
              }
              iVar5 = (int)local_b8;
              uVar16 = uVar16 + iVar5;
              uVar3 = uVar3 + iVar5;
              uVar10 = uVar10 + iVar5;
              uVar11 = uVar11 + iVar5;
              uVar21 = uVar21 - 1;
              uVar17 = local_b8;
            } while (uVar21 != 0);
          }
          iVar12 = local_b0._0_4_ + 1;
          uVar20 = uVar20 + local_98._0_4_;
          uVar3 = local_f8._0_4_ + local_98._0_4_;
          uVar10 = local_a8._0_4_ + local_98._0_4_;
          uVar11 = local_90._0_4_ + local_98._0_4_;
          iVar5 = (int)local_c0;
        } while (iVar12 != iVar5);
      }
      local_108 = 3;
      if (1 < iVar5) {
        uVar3 = (int)local_e8 * (int)uVar17;
        uVar11 = 1;
        local_f8 = (REF_DBL)CONCAT44(local_f8._4_4_,uVar3);
        iVar5 = 1;
        do {
          uVar20 = uVar11;
          uVar10 = local_fc;
          uVar16 = uVar3;
          if (1 < (int)uVar17) {
            do {
              local_114 = uVar20 - 1;
              local_118 = uVar20;
              local_110 = uVar16;
              uStack_10c = uVar16 + 1;
              uVar21 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_118,&local_11c);
              if (uVar21 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x5eb,"ref_fixture_pri_brick_args_grid",(ulong)uVar21,"qua");
                return uVar21;
              }
              uVar20 = uVar20 + 1;
              uVar10 = uVar10 - 1;
              uVar16 = uVar16 + 1;
            } while (uVar10 != 0);
          }
          iVar5 = iVar5 + 1;
          uVar3 = uVar3 + local_f8._0_4_;
          uVar11 = uVar11 + local_f8._0_4_;
          uVar17 = local_b8;
        } while (iVar5 != (int)local_c0);
      }
      local_108 = 4;
      if (1 < (int)local_c0) {
        iVar5 = (int)uVar17;
        uVar11 = local_dc * iVar5;
        uVar3 = ((int)local_e8 * 2 + -1) * iVar5;
        iVar5 = (int)local_e8 * iVar5;
        iVar12 = 1;
        do {
          uVar20 = local_fc;
          uVar10 = uVar3;
          local_dc = uVar11;
          if (1 < (int)uVar17) {
            do {
              local_118 = uVar11;
              local_114 = uVar11 + 1;
              local_110 = uVar10 + 1;
              uStack_10c = uVar10;
              uVar16 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_118,&local_11c);
              if (uVar16 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x5f7,"ref_fixture_pri_brick_args_grid",(ulong)uVar16,"qua");
                return uVar16;
              }
              uVar20 = uVar20 - 1;
              uVar11 = uVar11 + 1;
              uVar10 = uVar10 + 1;
            } while (uVar20 != 0);
          }
          iVar12 = iVar12 + 1;
          uVar3 = uVar3 + iVar5;
          uVar11 = local_dc + iVar5;
          uVar17 = local_b8;
        } while (iVar12 != (int)local_c0);
      }
      local_108 = 7;
      local_cc = 7;
      iVar5 = (int)local_e8;
      if (1 < iVar5) {
        uVar11 = 1;
        uVar7 = uVar17 & 0xffffffff;
        local_128 = 1;
        do {
          local_f8 = (REF_DBL)CONCAT44(local_f8._4_4_,uVar11);
          local_a8 = (REF_DBL)CONCAT44(local_a8._4_4_,(int)uVar7);
          uVar17 = local_78 & 0xffffffff;
          if (0 < (int)local_78) {
            do {
              local_118 = uVar11 - 1;
              uStack_10c = (uint)uVar7;
              local_110 = uStack_10c + 1;
              uVar7 = (ulong)local_110;
              local_d4 = CONCAT44(local_110,uVar11);
              local_114 = uVar11;
              local_d8 = local_118;
              uVar3 = ref_cell_add(local_f0->cell[3],(REF_INT *)&local_d8,&local_11c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x607,"ref_fixture_pri_brick_args_grid",(ulong)uVar3,"tri");
                return uVar3;
              }
              local_d8 = local_118;
              local_d4 = CONCAT44(uStack_10c,local_110);
              uVar3 = ref_cell_add(local_f0->cell[3],(REF_INT *)&local_d8,&local_11c);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x60b,"ref_fixture_pri_brick_args_grid",(ulong)uVar3,"tri");
                return uVar3;
              }
              uVar11 = uVar11 + 1;
              uVar3 = (int)uVar17 - 1;
              uVar17 = (ulong)uVar3;
            } while (uVar3 != 0);
          }
          local_128 = local_128 + 1;
          uVar7 = (ulong)(uint)(local_a8._0_4_ + (int)local_b8);
          uVar11 = local_f8._0_4_ + (int)local_b8;
          iVar5 = (int)local_e8;
          uVar17 = local_b8;
        } while (local_128 != iVar5);
      }
      local_108 = 5;
      local_cc = 5;
      if (1 < iVar5) {
        iVar12 = (int)local_78 + 1;
        local_128 = 1;
        local_f8 = (REF_DBL)CONCAT44(local_f8._4_4_,iVar12);
        uVar7 = local_78;
        uVar22 = local_78;
        do {
          while (local_78 = uVar22, iVar15 = (int)uVar17, iVar12 < iVar15) {
            local_118 = (uint)uVar7;
            uVar3 = local_118 + 1;
            uStack_10c = iVar15 + local_118;
            local_110 = iVar15 + local_118 + 1;
            local_d4 = CONCAT44(local_110,uVar3);
            local_114 = uVar3;
            local_d8 = local_118;
            uVar11 = ref_cell_add(local_f0->cell[3],(REF_INT *)&local_d8,&local_11c);
            if (uVar11 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x61b,"ref_fixture_pri_brick_args_grid",(ulong)uVar11,"tri");
              return uVar11;
            }
            local_d8 = local_118;
            local_d4 = CONCAT44(uStack_10c,local_110);
            uVar11 = ref_cell_add(local_f0->cell[3],(REF_INT *)&local_d8,&local_11c);
            if (uVar11 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x61f,"ref_fixture_pri_brick_args_grid",(ulong)uVar11,"tri");
              uVar4 = uVar11;
            }
            uVar7 = (ulong)uVar3;
            uVar17 = local_b8;
            iVar12 = iVar12 + 1;
            uVar22 = local_78;
            if (uVar11 != 0) {
              return uVar4;
            }
          }
          local_128 = local_128 + 1;
          uVar7 = (ulong)(uint)((int)local_78 + iVar15);
          iVar12 = local_f8._0_4_;
          uVar22 = uVar7;
        } while (local_128 != iVar5);
      }
      iVar12 = (int)uVar17;
      local_108 = 6;
      local_cc = 6;
      if (1 < iVar5) {
        uVar11 = local_84 * iVar5 * iVar12;
        iVar15 = iVar12 + -1;
        uVar4 = (local_84 * iVar5 + 1) * iVar12;
        local_130 = 1;
        do {
          iVar5 = iVar15;
          uVar3 = uVar11;
          local_84 = uVar4;
          if (1 < (int)uVar17) {
            do {
              uVar20 = uVar3 + 1;
              uVar10 = uVar4 + 1;
              local_d4 = CONCAT44(uVar20,uVar10);
              local_118 = uVar20;
              local_114 = uVar3;
              local_110 = uVar4;
              uStack_10c = uVar10;
              local_d8 = uVar3;
              uVar4 = ref_cell_add(local_f0->cell[3],(REF_INT *)&local_d8,&local_11c);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x62f,"ref_fixture_pri_brick_args_grid",(ulong)uVar4,"tri");
                return uVar4;
              }
              local_d8 = local_114;
              local_d4 = CONCAT44(uStack_10c,local_110);
              uVar4 = ref_cell_add(local_f0->cell[3],(REF_INT *)&local_d8,&local_11c);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x633,"ref_fixture_pri_brick_args_grid",(ulong)uVar4,"tri");
                return uVar4;
              }
              iVar5 = iVar5 + -1;
              uVar4 = uVar10;
              uVar3 = uVar20;
            } while (iVar5 != 0);
          }
          local_130 = local_130 + 1;
          iVar12 = (int)local_b8;
          uVar4 = local_84 + iVar12;
          uVar11 = uVar11 + iVar12;
          iVar5 = (int)local_e8;
          uVar17 = local_b8;
        } while (local_130 != iVar5);
      }
      uVar3 = ref_node_initialize_n_global(local_38,(long)(iVar5 * iVar12 * (int)local_c0));
      if (uVar3 == 0) {
        return 0;
      }
      uVar9 = 0x636;
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(long)(m * l * n));
      if (uVar3 == 0) {
        return 0;
      }
      uVar9 = 0x59c;
    }
    uVar7 = (ulong)uVar3;
    pcVar14 = "init glob";
  }
  else {
    pcVar14 = "create";
    uVar9 = 0x597;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9,
         "ref_fixture_pri_brick_args_grid",uVar7,pcVar14);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n,
    REF_INT l0) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], pri[6], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  l0 = MAX(0, l0);
  l0 = MIN(l0, l - 1);

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        pri[0] = hex[0];
        pri[1] = hex[1];
        pri[2] = hex[2];
        pri[3] = hex[4];
        pri[4] = hex[5];
        pri[5] = hex[6];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
        pri[0] = hex[0];
        pri[1] = hex[2];
        pri[2] = hex[3];
        pri[3] = hex[4];
        pri[4] = hex[6];
        pri[5] = hex[7];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
      }

  quad[4] = 1;
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 2;
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 3;
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 4;
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 7;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l0 + 1; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = l0 + 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[1];
      tri[1] = quad[3];
      tri[2] = quad[0];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}